

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_make_primitive(REF_DBL *conserved,REF_DBL *primitive)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar1 = *conserved;
  dVar3 = conserved[3] / dVar1;
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4 = divpd(*(undefined1 (*) [16])(conserved + 1),auVar4);
  dVar2 = conserved[4];
  *primitive = dVar1;
  *(undefined1 (*) [16])(primitive + 1) = auVar4;
  primitive[3] = dVar3;
  primitive[4] = ((dVar3 * dVar3 + auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_) *
                  dVar1 * -0.5 + dVar2) * 0.3999999999999999;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_make_primitive(REF_DBL *conserved,
                                           REF_DBL *primitive) {
  REF_DBL rho, u, v, w, p, e;
  REF_DBL gamma = 1.4;
  rho = conserved[0];
  u = conserved[1] / conserved[0];
  v = conserved[2] / conserved[0];
  w = conserved[3] / conserved[0];
  e = conserved[4];
  p = (gamma - 1.0) * (e - 0.5 * rho * (u * u + v * v + w * w));

  primitive[0] = rho;
  primitive[1] = u;
  primitive[2] = v;
  primitive[3] = w;
  primitive[4] = p;

  return REF_SUCCESS;
}